

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.cpp
# Opt level: O2

bool __thiscall Shell::NewCNF::shouldInlineITE(NewCNF *this,uint iteCounter)

{
  return (bool)(iteCounter < this->_iteInliningThreshold | this->_forInduction);
}

Assistant:

bool NewCNF::shouldInlineITE(unsigned iteCounter) {
  /*
   * MS : TODO:
   * Since "_iteInliningThreshold = (unsigned)ceil(log2(namingThreshold))",
   * which evaluates to 0 for 0, and since "namingThreshold == 0" means
   * "never name anything", it would make sense to add
   * "|| _iteInliningThreshold == 0" here.
   */
  return _forInduction || iteCounter < _iteInliningThreshold;
}